

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  long lVar1;
  long lVar2;
  VersionSet *pVVar3;
  int iVar4;
  undefined4 extraout_var;
  Slice *in_RDX;
  uint32_t *puVar5;
  int level;
  long lVar6;
  size_t i;
  ulong uVar7;
  string record;
  VersionEdit edit;
  string local_118;
  Slice *local_f8;
  VersionSet *local_f0;
  Slice local_e8;
  VersionEdit local_d8;
  
  local_f8 = in_RDX;
  local_f0 = this;
  VersionEdit::VersionEdit(&local_d8);
  iVar4 = (*(log[2].dest_)->_vptr_WritableFile[3])();
  local_118._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar4);
  local_118._M_string_length = strlen(local_118._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_d8,(Slice *)&local_118);
  puVar5 = log[0xb].type_crc_ + 3;
  for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
    if (*(size_t *)puVar5 != 0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_e8.data_ = *(char **)(puVar5 + -2);
      local_e8.size_ = *(size_t *)puVar5;
      InternalKey::DecodeFrom((InternalKey *)&local_118,&local_e8);
      VersionEdit::SetCompactPointer(&local_d8,(int)lVar6,(InternalKey *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    puVar5 = puVar5 + 8;
  }
  for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
    lVar1 = *(long *)&log[0xb].block_offset_ + lVar6 * 0x18;
    for (uVar7 = 0; lVar2 = *(long *)(lVar1 + 0x20),
        uVar7 < (ulong)(*(long *)(lVar1 + 0x28) - lVar2 >> 3); uVar7 = uVar7 + 1) {
      lVar2 = *(long *)(lVar2 + uVar7 * 8);
      VersionEdit::AddFile
                (&local_d8,(int)lVar6,*(uint64_t *)(lVar2 + 8),*(uint64_t *)(lVar2 + 0x10),
                 (InternalKey *)(lVar2 + 0x18),(InternalKey *)(lVar2 + 0x38));
    }
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  VersionEdit::EncodeTo(&local_d8,&local_118);
  pVVar3 = local_f0;
  local_e8.data_ = local_118._M_dataplus._M_p;
  local_e8.size_ = local_118._M_string_length;
  leveldb::log::Writer::AddRecord((Writer *)local_f0,local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  VersionEdit::~VersionEdit(&local_d8);
  return (Status)(char *)pVVar3;
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}